

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

char * SDL_AudioDriverName(char *namebuf,int maxlen)

{
  char *pcVar1;
  int maxlen_local;
  char *namebuf_local;
  
  pcVar1 = (*SDL20_GetCurrentAudioDriver)();
  pcVar1 = GetDriverName(pcVar1,namebuf,maxlen);
  return pcVar1;
}

Assistant:

DECLSPEC12 const char * SDLCALL
SDL_AudioDriverName(char *namebuf, int maxlen)
{
    return GetDriverName(SDL20_GetCurrentAudioDriver(), namebuf, maxlen);
}